

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::make_multipart_data_boundary_abi_cxx11_(void)

{
  uint uVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  int iVar4;
  string *in_RDI;
  mt19937 engine;
  random_device seed_gen;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar1 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar1;
  lVar3 = 1;
  uVar2 = local_2740._M_x[0];
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    local_2740._M_x[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_2740._M_p = 0x270;
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>();
  iVar4 = 0x10;
  do {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::operator()(&local_2740);
    std::__cxx11::string::push_back((char)in_RDI);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  std::random_device::_M_fini();
  return in_RDI;
}

Assistant:

inline std::string make_multipart_data_boundary() {
  static const char data[] =
      "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

  std::random_device seed_gen;
  std::mt19937 engine(seed_gen());

  std::string result = "--cpp-httplib-multipart-data-";

  for (auto i = 0; i < 16; i++) {
    result += data[engine() % (sizeof(data) - 1)];
  }

  return result;
}